

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialStatistics.cpp
# Opt level: O2

void __thiscall OpenMD::ShellStatistics::processFrame(ShellStatistics *this,int istep)

{
  SelectionManager *this_00;
  int iVar1;
  uint uVar2;
  StuntDouble *this_01;
  SelectionSet *v;
  int isd;
  int local_34;
  SelectionSet local_30;
  
  if ((this->comEvaluator_).isDynamic_ == true) {
    this_00 = &this->comSeleMan_;
    SelectionEvaluator::evaluate(&local_30,&this->comEvaluator_);
    SelectionManager::setSelectionSet(this_00,&local_30);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_30.bitsets_);
    iVar1 = SelectionManager::getSelectionCount(this_00);
    if (iVar1 != 1) {
      uVar2 = SelectionManager::getSelectionCount(this_00);
      snprintf(painCave.errMsg,2000,
               "ShellStatistics: More than one selected object in comsele.\n\tThere are %d selected objects.\n"
               ,(ulong)uVar2);
      painCave.isFatal = 1;
      simError();
    }
    this_01 = SelectionManager::beginSelected(this_00,&local_34);
    v = &local_30;
    StuntDouble::getPos((Vector3d *)v,this_01);
    Vector<double,_3U>::operator=
              (&(this->coordinateOrigin_).super_Vector<double,_3U>,(Vector<double,_3U> *)v);
    SpatialStatistics::processFrame(&this->super_SpatialStatistics,(int)v);
  }
  return;
}

Assistant:

void ShellStatistics::processFrame(int istep) {
    if (comEvaluator_.isDynamic()) {
      comSeleMan_.setSelectionSet(comEvaluator_.evaluate());
      if (comSeleMan_.getSelectionCount() != 1) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ShellStatistics: More than one selected object in "
                 "comsele.\n"
                 "\tThere are %d selected objects.\n",
                 comSeleMan_.getSelectionCount());
        painCave.isFatal = 1;
        simError();
      }
      int isd;
      StuntDouble* sd   = comSeleMan_.beginSelected(isd);
      coordinateOrigin_ = sd->getPos();

      SpatialStatistics::processFrame(istep);
    }
  }